

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

uint LZ4HC_countPattern(BYTE *ip,BYTE *iEnd,U32 pattern32)

{
  byte bVar1;
  uint uVar2;
  reg_t rVar3;
  bool bVar4;
  BYTE byte;
  ulong uStack_48;
  U32 bitOffset;
  reg_t patternByte;
  reg_t diff;
  reg_t pattern;
  BYTE *iStart;
  U32 pattern32_local;
  BYTE *iEnd_local;
  BYTE *ip_local;
  
  uStack_48 = CONCAT44(pattern32,pattern32);
  iEnd_local = ip;
  while( true ) {
    if (iEnd + -7 <= iEnd_local) {
      uVar2 = LZ4_isLittleEndian();
      if (uVar2 == 0) {
        bVar1 = 0x38;
        for (; (iEnd_local < iEnd && (*iEnd_local == (BYTE)(uStack_48 >> (bVar1 & 0x3f))));
            iEnd_local = iEnd_local + 1) {
          bVar1 = bVar1 - 8;
        }
      }
      else {
        while( true ) {
          bVar4 = false;
          if (iEnd_local < iEnd) {
            bVar4 = (uint)*iEnd_local == ((uint)uStack_48 & 0xff);
          }
          if (!bVar4) break;
          iEnd_local = iEnd_local + 1;
          uStack_48 = uStack_48 >> 8;
        }
      }
      return (int)iEnd_local - (int)ip;
    }
    rVar3 = LZ4_read_ARCH(iEnd_local);
    if ((rVar3 ^ uStack_48) != 0) break;
    iEnd_local = iEnd_local + 8;
  }
  uVar2 = LZ4_NbCommonBytes(rVar3 ^ uStack_48);
  return ((int)iEnd_local + uVar2) - (int)ip;
}

Assistant:

static unsigned
LZ4HC_countPattern(const BYTE* ip, const BYTE* const iEnd, U32 const pattern32)
{
    const BYTE* const iStart = ip;
    reg_t const pattern = (sizeof(pattern)==8) ?
        (reg_t)pattern32 + (((reg_t)pattern32) << (sizeof(pattern)*4)) : pattern32;

    while (likely(ip < iEnd-(sizeof(pattern)-1))) {
        reg_t const diff = LZ4_read_ARCH(ip) ^ pattern;
        if (!diff) { ip+=sizeof(pattern); continue; }
        ip += LZ4_NbCommonBytes(diff);
        return (unsigned)(ip - iStart);
    }

    if (LZ4_isLittleEndian()) {
        reg_t patternByte = pattern;
        while ((ip<iEnd) && (*ip == (BYTE)patternByte)) {
            ip++; patternByte >>= 8;
        }
    } else {  /* big endian */
        U32 bitOffset = (sizeof(pattern)*8) - 8;
        while (ip < iEnd) {
            BYTE const byte = (BYTE)(pattern >> bitOffset);
            if (*ip != byte) break;
            ip ++; bitOffset -= 8;
        }
    }

    return (unsigned)(ip - iStart);
}